

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O3

int point_mul_id_tc26_gost_3410_2012_512_paramSetC
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  uint64_t *puVar1;
  uint64_t *out1;
  char cVar2;
  byte arg1;
  int iVar3;
  int iVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  uint64_t *puVar7;
  uint64_t *puVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  byte bVar14;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  pt_prj_t_conflict4 Q;
  int8_t rnaf [103];
  pt_prj_t_conflict4 precomp [16];
  uint8_t local_18d8 [64];
  pt_aff_t_conflict4 local_1898;
  uint8_t local_17a8 [64];
  pt_prj_t_conflict4 local_1768;
  byte local_1628 [64];
  pt_prj_t_conflict4 local_15e8;
  undefined1 local_14a8 [16];
  undefined1 local_1498 [16];
  undefined1 local_1488 [16];
  undefined1 local_1478 [16];
  undefined1 local_1468 [16];
  undefined1 local_1458 [15];
  undefined1 uStack_1449;
  undefined6 uStack_1448;
  char cStack_1442;
  pt_prj_t_conflict4 local_1438 [16];
  
  bVar14 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  pBVar6 = BN_CTX_get((BN_CTX *)ctx);
  iVar4 = 0;
  iVar10 = 0;
  if ((((pBVar6 != (BIGNUM *)0x0) &&
       (iVar3 = EC_POINT_get_affine_coordinates(group,q,pBVar5,pBVar6,ctx), iVar10 = iVar4,
       iVar3 != 0)) && (iVar4 = BN_bn2lebinpad(pBVar5,local_17a8,0x40), iVar4 == 0x40)) &&
     ((iVar4 = BN_bn2lebinpad(pBVar6,local_18d8,0x40), iVar4 == 0x40 &&
      (iVar4 = BN_bn2lebinpad(m,local_1628,0x40), iVar4 == 0x40)))) {
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1898.X,local_17a8);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(local_1898.Y,local_18d8);
    local_1458 = SUB1615((undefined1  [16])0x0,0);
    local_1468 = (undefined1  [16])0x0;
    local_1478 = (undefined1  [16])0x0;
    local_1488 = (undefined1  [16])0x0;
    local_1498 = (undefined1  [16])0x0;
    local_14a8 = (undefined1  [16])0x0;
    uStack_1449 = 0;
    uStack_1448 = 0;
    cStack_1442 = '\0';
    lVar11 = 0;
    memset(&local_15e8,0,0x140);
    memset(&local_1768,0,0x140);
    precomp_wnaf(local_1438,&local_1898);
    scalar_rwnaf(local_14a8,local_1628);
    iVar10 = (int)cStack_1442;
    lVar9 = 0;
    do {
      bVar13 = (int)(iVar10 + -1 >> 1 ^ (uint)lVar9) < 1;
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (local_15e8.X,bVar13,local_15e8.X,(uint64_t *)((long)local_1438[0].X + lVar11));
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (local_15e8.Y,bVar13,local_15e8.Y,(uint64_t *)((long)local_1438[0].Y + lVar11));
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (local_15e8.T,bVar13,local_15e8.T,(uint64_t *)((long)local_1438[0].T + lVar11));
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (local_15e8.Z,bVar13,local_15e8.Z,(uint64_t *)((long)local_1438[0].Z + lVar11));
      lVar9 = lVar9 + 1;
      lVar11 = lVar11 + 0x140;
    } while (lVar9 != 0x10);
    puVar1 = local_1768.T;
    out1 = local_1768.Z;
    lVar9 = 0x65;
    do {
      iVar10 = 5;
      do {
        point_double(&local_15e8,&local_15e8);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      cVar2 = local_14a8[lVar9];
      lVar11 = 0;
      lVar12 = 0;
      do {
        bVar13 = (int)((int)(char)(-1 - (cVar2 >> 7)) + ((int)cVar2 >> 0x1f ^ (int)cVar2) >> 1 ^
                      (uint)lVar12) < 1;
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                  (local_1768.X,bVar13,local_1768.X,(uint64_t *)((long)local_1438[0].X + lVar11));
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                  (local_1768.Y,bVar13,local_1768.Y,(uint64_t *)((long)local_1438[0].Y + lVar11));
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                  (puVar1,bVar13,puVar1,(uint64_t *)((long)local_1438[0].T + lVar11));
        fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                  (out1,bVar13,out1,(uint64_t *)((long)local_1438[0].Z + lVar11));
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x140;
      } while (lVar12 != 0x10);
      local_1898.X[0] = 0x1ffffffffffb8e - local_1768.X[0];
      local_1898.X[1] = 0xffffffffffffe - local_1768.X[1];
      local_1898.X[2] = 0xffffffffffffe - local_1768.X[2];
      local_1898.X[3] = 0xffffffffffffe - local_1768.X[3];
      local_1898.X[4] = 0xffffffffffffe - local_1768.X[4];
      local_1898.X[5] = 0x1ffffffffffffe - local_1768.X[5];
      local_1898.X[6] = 0xffffffffffffe - local_1768.X[6];
      local_1898.X[7] = 0xffffffffffffe - local_1768.X[7];
      local_1898.X[8] = 0xffffffffffffe - local_1768.X[8];
      local_1898.X[9] = 0xffffffffffffe - local_1768.X[9];
      local_1898.T[0] = 0x1ffffffffffb8e - local_1768.T[0];
      local_1898.T[1] = 0xffffffffffffe - local_1768.T[1];
      local_1898.T[2] = 0xffffffffffffe - local_1768.T[2];
      local_1898.T[3] = 0xffffffffffffe - local_1768.T[3];
      local_1898.T[4] = 0xffffffffffffe - local_1768.T[4];
      local_1898.T[5] = 0x1ffffffffffffe - local_1768.T[5];
      local_1898.T[6] = 0xffffffffffffe - local_1768.T[6];
      local_1898.T[7] = 0xffffffffffffe - local_1768.T[7];
      local_1898.T[8] = 0xffffffffffffe - local_1768.T[8];
      local_1898.T[9] = 0xffffffffffffe - local_1768.T[9];
      arg1 = (byte)(cVar2 >> 7) >> 7;
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
                (local_1768.X,arg1,local_1768.X,local_1898.X);
      fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(puVar1,arg1,puVar1,local_1898.T);
      point_add_proj(&local_15e8,&local_15e8,&local_1768);
      bVar13 = lVar9 != 0;
      lVar9 = lVar9 + -1;
    } while (bVar13);
    local_1768.X[0] = 0x1ffffffffffb8e - local_1438[0].X[0];
    local_1768.X[1] = 0xffffffffffffe - local_1438[0].X[1];
    local_1768.X[2] = 0xffffffffffffe - local_1438[0].X[2];
    local_1768.X[3] = 0xffffffffffffe - local_1438[0].X[3];
    local_1768.X[4] = 0xffffffffffffe - local_1438[0].X[4];
    local_1768.X[5] = 0x1ffffffffffffe - local_1438[0].X[5];
    local_1768.X[6] = 0xffffffffffffe - local_1438[0].X[6];
    local_1768.X[7] = 0xffffffffffffe - local_1438[0].X[7];
    local_1768.X[8] = 0xffffffffffffe - local_1438[0].X[8];
    local_1768.X[9] = 0xffffffffffffe - local_1438[0].X[9];
    puVar7 = local_1438[0].Y;
    puVar8 = local_1768.Y;
    for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar14 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
    }
    local_1768.T[0] = 0x1ffffffffffb8e - local_1438[0].T[0];
    local_1768.T[1] = 0xffffffffffffe - local_1438[0].T[1];
    local_1768.T[2] = 0xffffffffffffe - local_1438[0].T[2];
    local_1768.T[3] = 0xffffffffffffe - local_1438[0].T[3];
    local_1768.T[4] = 0xffffffffffffe - local_1438[0].T[4];
    local_1768.T[5] = 0x1ffffffffffffe - local_1438[0].T[5];
    local_1768.T[6] = 0xffffffffffffe - local_1438[0].T[6];
    local_1768.T[7] = 0xffffffffffffe - local_1438[0].T[7];
    local_1768.T[8] = 0xffffffffffffe - local_1438[0].T[8];
    local_1768.T[9] = 0xffffffffffffe - local_1438[0].T[9];
    puVar7 = local_1438[0].Z;
    puVar8 = out1;
    for (lVar9 = 10; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar14 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar14 * -2 + 1;
    }
    point_add_proj(&local_1768,&local_1768,&local_15e8);
    bVar14 = local_1628[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz
              (local_15e8.X,bVar14,local_1768.X,local_15e8.X);
    puVar7 = local_15e8.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(puVar7,bVar14,local_1768.Y,puVar7);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(local_15e8.T,bVar14,puVar1,local_15e8.T);
    puVar1 = local_15e8.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetC_selectznz(puVar1,bVar14,out1,puVar1);
    point_double(&local_15e8,&local_15e8);
    point_double(&local_15e8,&local_15e8);
    point_edwards2legacy(&local_15e8,&local_15e8);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_inv(puVar1,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1898.X,local_15e8.X,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(local_1898.Y,puVar7,puVar1);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(local_17a8,local_1898.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(local_18d8,local_1898.Y);
    iVar10 = CRYPTO_memcmp("",local_17a8,0x40);
    if ((iVar10 == 0) && (iVar10 = CRYPTO_memcmp("",local_18d8,0x40), iVar10 == 0)) {
      iVar10 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar10 == 0) {
        iVar10 = 0;
        goto LAB_00141aa2;
      }
    }
    else {
      lVar9 = BN_lebin2bn(local_17a8,0x40,pBVar5);
      iVar10 = 0;
      if ((lVar9 == 0) ||
         ((lVar9 = BN_lebin2bn(local_18d8,0x40,pBVar6), lVar9 == 0 ||
          (iVar4 = EC_POINT_set_affine_coordinates(group,r,pBVar5,pBVar6,ctx), iVar4 == 0))))
      goto LAB_00141aa2;
    }
    iVar10 = 1;
  }
LAB_00141aa2:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar10;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_512_paramSetC(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}